

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualTwoBytes_Test::~TEST_TestFailure_BinaryEqualTwoBytes_Test
          (TEST_TestFailure_BinaryEqualTwoBytes_Test *this)

{
  TEST_TestFailure_BinaryEqualTwoBytes_Test *this_local;
  
  ~TEST_TestFailure_BinaryEqualTwoBytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualTwoBytes)
{
    const unsigned char expectedData[] = {0x00, 0x01};
    const unsigned char actualData[] = {0x00, 0x02};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 01>\n"
                "\tbut was  <00 02>\n"
    			"\tdifference starts at position 1 at: <      00 02         >\n"
    			"\t                                               ^", f);
}